

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O2

void __thiscall Percentile::generateCode(Percentile *this)

{
  unsigned_long *puVar1;
  size_t sVar2;
  Attribute *pAVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *__rhs;
  ulong attID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  string local_898;
  string local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  string local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  string runFunction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  string printPerc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string printPercTensorFlow;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string percentileComp;
  string numPercStr;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  ofstream ofs;
  
  puVar1 = *(unsigned_long **)
            &((*(this->varToQuery[100]->_aggregates).
                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                super__Vector_impl_data._M_start)->_incoming).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data;
  std::__cxx11::to_string(&numPercStr,0x14);
  Application::offset_abi_cxx11_(&local_7d8,&this->super_Application,2);
  std::operator+(&local_758,&local_7d8,"size_t tupleCount = (size_t)V");
  std::__cxx11::to_string(&local_778,*puVar1);
  std::operator+(&local_738,&local_758,&local_778);
  std::operator+(&local_718,&local_738,"[0].aggregates[");
  std::__cxx11::to_string(&local_7f8,puVar1[1]);
  std::operator+(&local_858,&local_718,&local_7f8);
  std::operator+(&local_6f8,&local_858,"], offset = 0, pIndex = 0;\n");
  Application::offset_abi_cxx11_(&local_878,&this->super_Application,2);
  std::operator+(&local_7b8,&local_6f8,&local_878);
  std::operator+(&local_6d8,&local_7b8,"size_t percentileCounts[");
  std::operator+(&local_8b8,&local_6d8,&numPercStr);
  std::operator+(&local_6b8,&local_8b8,"];\n");
  Application::offset_abi_cxx11_(&local_818,&this->super_Application,2);
  std::operator+(&local_798,&local_6b8,&local_818);
  std::operator+(&local_8d8,&local_798,"for (size_t i = 1; i < ");
  std::operator+(&local_8f8,&local_8d8,&numPercStr);
  std::operator+(&runFunction,&local_8f8,"; i++)\n");
  Application::offset_abi_cxx11_(&local_898,&this->super_Application,3);
  std::operator+(&printPercTensorFlow,&runFunction,&local_898);
  std::operator+(&printPerc,&printPercTensorFlow,"percentileCounts[i-1] = ceil(");
  std::__cxx11::to_string(&local_838,0.05);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 &printPerc,&local_838);
  std::operator+(&percentileComp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 "*i*tupleCount);\n\n");
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&printPerc);
  std::__cxx11::string::~string((string *)&printPercTensorFlow);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&runFunction);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::string((string *)&printPerc,"",(allocator *)&ofs);
  std::__cxx11::string::string((string *)&printPercTensorFlow,"",(allocator *)&ofs);
  attID = 0;
  while( true ) {
    sVar2 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar2 <= attID) break;
    pAVar3 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        attID);
    __rhs = &pAVar3->_name;
    if ((((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[attID >> 6] >>
          (attID & 0x3f) & 1) == 0) ||
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[attID >> 6] &
        1L << ((byte)attID & 0x3f)) != 0)) {
      Application::offset_abi_cxx11_(&local_8d8,&this->super_Application,2);
      std::operator+(&local_8f8,&local_8d8,"std::cout << \"{},// percentiles ");
      std::operator+(&runFunction,&local_8f8,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                     &runFunction,"\"<<std::endl;\n");
      std::__cxx11::string::append((string *)&printPerc);
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::string::~string((string *)&runFunction);
      std::__cxx11::string::~string((string *)&local_8f8);
      this_00 = &local_8d8;
    }
    else {
      puVar1 = *(unsigned_long **)
                &((*(this->varToQuery[attID]->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->_incoming).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data;
      std::__cxx11::to_string(&runFunction,*puVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,"V",
                     &runFunction);
      std::__cxx11::string::~string((string *)&runFunction);
      pAVar3 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          attID);
      Application::typeToStr_abi_cxx11_(&runFunction,&this->super_Application,pAVar3->_type);
      Application::offset_abi_cxx11_(&local_490,&this->super_Application,2);
      std::operator+(&local_4f0,&local_490,"offset = 0; pIndex = 0;\n");
      Application::offset_abi_cxx11_(&local_250,&this->super_Application,2);
      std::operator+(&local_470,&local_4f0,&local_250);
      std::operator+(&local_450,&local_470,&runFunction);
      std::operator+(&local_430,&local_450," percentiles");
      std::operator+(&local_410,&local_430,__rhs);
      std::operator+(&local_4d0,&local_410,"[");
      std::__cxx11::to_string(&local_270,0x13);
      std::operator+(&local_538,&local_4d0,&local_270);
      std::operator+(&local_558,&local_538,"];\n");
      Application::offset_abi_cxx11_(&local_290,&this->super_Application,2);
      std::operator+(&local_638,&local_558,&local_290);
      std::operator+(&local_618,&local_638,"for (");
      std::operator+(&local_5f8,&local_618,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs);
      std::operator+(&local_5b8,&local_5f8,"_tuple& tuple : ");
      std::operator+(&local_598,&local_5b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs);
      std::operator+(&local_5d8,&local_598,")\n");
      Application::offset_abi_cxx11_(&local_2b0,&this->super_Application,2);
      std::operator+(&local_578,&local_5d8,&local_2b0);
      std::operator+(&local_658,&local_578,"{\n");
      Application::offset_abi_cxx11_(&local_2d0,&this->super_Application,3);
      std::operator+(&local_678,&local_658,&local_2d0);
      std::operator+(&local_838,&local_678,"offset += tuple.aggregates[");
      std::__cxx11::to_string(&local_2f0,puVar1[1]);
      std::operator+(&local_898,&local_838,&local_2f0);
      std::operator+(&local_818,&local_898,"];\n");
      Application::offset_abi_cxx11_(&local_310,&this->super_Application,3);
      std::operator+(&local_878,&local_818,&local_310);
      std::operator+(&local_7f8,&local_878,"while(offset >= percentileCounts[pIndex])\n");
      Application::offset_abi_cxx11_(&local_330,&this->super_Application,3);
      std::operator+(&local_778,&local_7f8,&local_330);
      std::operator+(&local_7d8,&local_778,"{\n");
      Application::offset_abi_cxx11_(&local_350,&this->super_Application,4);
      std::operator+(&local_758,&local_7d8,&local_350);
      std::operator+(&local_738,&local_758,"percentiles");
      std::operator+(&local_718,&local_738,__rhs);
      std::operator+(&local_858,&local_718,"[pIndex] = tuple.");
      std::operator+(&local_6f8,&local_858,__rhs);
      std::operator+(&local_7b8,&local_6f8,";\n");
      Application::offset_abi_cxx11_(&local_370,&this->super_Application,4);
      std::operator+(&local_6d8,&local_7b8,&local_370);
      std::operator+(&local_8b8,&local_6d8,"++pIndex;\n");
      Application::offset_abi_cxx11_(&local_390,&this->super_Application,3);
      std::operator+(&local_6b8,&local_8b8,&local_390);
      std::operator+(&local_798,&local_6b8,"}\n");
      Application::offset_abi_cxx11_(&local_3b0,&this->super_Application,2);
      std::operator+(&local_8d8,&local_798,&local_3b0);
      std::operator+(&local_8f8,&local_8d8,"}\n\n");
      std::__cxx11::string::append((string *)&percentileComp);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_490);
      Application::offset_abi_cxx11_(&local_5d8,&this->super_Application,2);
      std::operator+(&local_578,&local_5d8,"std::cout << \"{\"<<percentiles");
      std::operator+(&local_658,&local_578,__rhs);
      std::operator+(&local_678,&local_658,"[0];\n");
      Application::offset_abi_cxx11_(&local_598,&this->super_Application,2);
      std::operator+(&local_838,&local_678,&local_598);
      std::operator+(&local_898,&local_838,"for (size_t p = 1; p < ");
      std::__cxx11::to_string(&local_5b8,0x13);
      std::operator+(&local_818,&local_898,&local_5b8);
      std::operator+(&local_878,&local_818,"; ++p)\n");
      Application::offset_abi_cxx11_(&local_5f8,&this->super_Application,3);
      std::operator+(&local_7f8,&local_878,&local_5f8);
      std::operator+(&local_778,&local_7f8,"if (percentiles");
      std::operator+(&local_7d8,&local_778,__rhs);
      std::operator+(&local_758,&local_7d8,"[p] != ");
      std::operator+(&local_738,&local_758,"percentiles");
      std::operator+(&local_718,&local_738,__rhs);
      std::operator+(&local_858,&local_718,"[p-1])\n");
      Application::offset_abi_cxx11_(&local_618,&this->super_Application,4);
      std::operator+(&local_6f8,&local_858,&local_618);
      std::operator+(&local_7b8,&local_6f8,"std::cout << \",\" << percentiles");
      std::operator+(&local_6d8,&local_7b8,__rhs);
      std::operator+(&local_8b8,&local_6d8,"[p];\n");
      Application::offset_abi_cxx11_(&local_638,&this->super_Application,2);
      std::operator+(&local_6b8,&local_8b8,&local_638);
      std::operator+(&local_798,&local_6b8,"std::cout << \"},// percentiles ");
      std::operator+(&local_8d8,&local_798,__rhs);
      std::operator+(&local_8f8,&local_8d8,"\"<< std::endl;\n");
      std::__cxx11::string::append((string *)&printPerc);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_5d8);
      Application::offset_abi_cxx11_(&local_5b8,&this->super_Application,2);
      std::operator+(&local_598,&local_5b8,"std::cout << \"\'");
      std::operator+(&local_5d8,&local_598,__rhs);
      std::operator+(&local_578,&local_5d8,"\': \" << \"[\"<<percentiles");
      std::operator+(&local_658,&local_578,__rhs);
      std::operator+(&local_678,&local_658,"[0];\n");
      Application::offset_abi_cxx11_(&local_5f8,&this->super_Application,2);
      std::operator+(&local_838,&local_678,&local_5f8);
      std::operator+(&local_898,&local_838,"for (size_t p = 1; p < ");
      std::__cxx11::to_string(&local_618,0x13);
      std::operator+(&local_818,&local_898,&local_618);
      std::operator+(&local_878,&local_818,"; ++p)\n");
      Application::offset_abi_cxx11_(&local_638,&this->super_Application,3);
      std::operator+(&local_7f8,&local_878,&local_638);
      std::operator+(&local_778,&local_7f8,"if (percentiles");
      std::operator+(&local_7d8,&local_778,__rhs);
      std::operator+(&local_758,&local_7d8,"[p] != ");
      std::operator+(&local_738,&local_758,"percentiles");
      std::operator+(&local_718,&local_738,__rhs);
      std::operator+(&local_858,&local_718,"[p-1])\n");
      Application::offset_abi_cxx11_(&local_558,&this->super_Application,4);
      std::operator+(&local_6f8,&local_858,&local_558);
      std::operator+(&local_7b8,&local_6f8,"std::cout << \",\" << percentiles");
      std::operator+(&local_6d8,&local_7b8,__rhs);
      std::operator+(&local_8b8,&local_6d8,"[p];\n");
      Application::offset_abi_cxx11_(&local_538,&this->super_Application,2);
      std::operator+(&local_6b8,&local_8b8,&local_538);
      std::operator+(&local_798,&local_6b8,"std::cout << \"],  ## percentiles ");
      std::operator+(&local_8d8,&local_798,__rhs);
      std::operator+(&local_8f8,&local_8d8,"\"<< std::endl;\n");
      std::__cxx11::string::append((string *)&printPercTensorFlow);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&runFunction);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs;
    }
    std::__cxx11::string::~string((string *)this_00);
    attID = attID + 1;
  }
  Application::offset_abi_cxx11_(&local_618,&this->super_Application,1);
  std::operator+(&local_5f8,&local_618,"void runApplication()\n");
  Application::offset_abi_cxx11_(&local_638,&this->super_Application,1);
  std::operator+(&local_5b8,&local_5f8,&local_638);
  std::operator+(&local_598,&local_5b8,"{\n");
  Application::offset_abi_cxx11_(&local_558,&this->super_Application,2);
  std::operator+(&local_5d8,&local_598,&local_558);
  std::operator+(&local_578,&local_5d8,"int64_t startProcess = duration_cast<milliseconds>(");
  std::operator+(&local_658,&local_578,"system_clock::now().time_since_epoch()).count();\n");
  std::operator+(&local_678,&local_658,&percentileComp);
  std::operator+(&local_838,&local_678,"\n");
  Application::offset_abi_cxx11_(&local_538,&this->super_Application,2);
  std::operator+(&local_898,&local_838,&local_538);
  std::operator+(&local_818,&local_898,"int64_t endProcess = duration_cast<milliseconds>(");
  std::operator+(&local_878,&local_818,
                 "system_clock::now().time_since_epoch()).count()-startProcess;\n");
  Application::offset_abi_cxx11_(&local_4d0,&this->super_Application,2);
  std::operator+(&local_7f8,&local_878,&local_4d0);
  std::operator+(&local_778,&local_7f8,"std::cout << \"Run Application: \"+");
  std::operator+(&local_7d8,&local_778,"std::to_string(endProcess)+\"ms.\\n\";\n\n");
  Application::offset_abi_cxx11_(&local_410,&this->super_Application,2);
  std::operator+(&local_758,&local_7d8,&local_410);
  std::operator+(&local_738,&local_758,"std::ofstream ofs(\"times.txt\",std::ofstream::out | ");
  std::operator+(&local_718,&local_738,"std::ofstream::app);\n");
  Application::offset_abi_cxx11_(&local_430,&this->super_Application,2);
  std::operator+(&local_858,&local_718,&local_430);
  std::operator+(&local_6f8,&local_858,"ofs << \"\\t\" << endProcess << std::endl;\n");
  Application::offset_abi_cxx11_(&local_450,&this->super_Application,2);
  std::operator+(&local_7b8,&local_6f8,&local_450);
  std::operator+(&local_6d8,&local_7b8,"ofs.close();\n\n");
  Application::offset_abi_cxx11_(&local_470,&this->super_Application,2);
  std::operator+(&local_8b8,&local_6d8,&local_470);
  std::operator+(&local_6b8,&local_8b8,"std::cout << \"_thresholds = {\\n\";");
  std::operator+(&local_798,&local_6b8,&printPerc);
  Application::offset_abi_cxx11_(&local_4f0,&this->super_Application,2);
  std::operator+(&local_8d8,&local_798,&local_4f0);
  std::operator+(&local_8f8,&local_8d8,"std::cout << \"};\\n\";");
  Application::offset_abi_cxx11_(&local_490,&this->super_Application,1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 &local_8f8,&local_490);
  std::operator+(&runFunction,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,"}\n");
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_618);
  std::operator+(&local_8f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"ApplicationHandler.h");
  std::ofstream::ofstream(&ofs,(string *)&local_8f8,_S_out);
  std::__cxx11::string::~string((string *)&local_8f8);
  poVar4 = std::operator<<((ostream *)&ofs,"#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n");
  poVar4 = std::operator<<(poVar4,"#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n");
  poVar4 = std::operator<<(poVar4,"#include \"DataHandler.h\"\n\n");
  poVar4 = std::operator<<(poVar4,"namespace lmfao\n{\n");
  Application::offset_abi_cxx11_(&local_8d8,&this->super_Application,1);
  std::operator+(&local_8f8,&local_8d8,"void runApplication();\n");
  poVar4 = std::operator<<(poVar4,(string *)&local_8f8);
  std::operator<<(poVar4,"}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n");
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::ofstream::close();
  std::operator+(&local_8f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"ApplicationHandler.cpp");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8f8);
  poVar4 = std::operator<<((ostream *)&ofs,"#include \"ApplicationHandler.h\"\n");
  std::operator<<(poVar4,"namespace lmfao\n{\n");
  poVar4 = std::operator<<((ostream *)&ofs,(string *)&runFunction);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&ofs,"}\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&runFunction);
  std::__cxx11::string::~string((string *)&printPercTensorFlow);
  std::__cxx11::string::~string((string *)&printPerc);
  std::__cxx11::string::~string((string *)&percentileComp);
  std::__cxx11::string::~string((string *)&numPercStr);
  return;
}

Assistant:

void Percentile::generateCode()
{
    Query* countQuery = varToQuery[NUM_OF_VARIABLES];
    size_t& countViewID = countQuery->_aggregates[0]->_incoming[0].first;
    size_t& countAggID = countQuery->_aggregates[0]->_incoming[0].second;

    std::string numPercStr = to_string(numberOfPercentiles);

    std::string percentileComp =
        // offset(1)+"void computePercentiles()\n"+offset(1)+"{\n"+
        offset(2)+"size_t tupleCount = (size_t)V"+to_string(countViewID)+
        "[0].aggregates["+to_string(countAggID)+"], offset = 0, pIndex = 0;\n"+
        offset(2)+"size_t percentileCounts["+numPercStr+"];\n"+
        offset(2)+"for (size_t i = 1; i < "+numPercStr+"; i++)\n"+
        offset(3)+"percentileCounts[i-1] = ceil("+
        to_string(100.0/(numberOfPercentiles*100))+"*i*tupleCount);\n\n";

    std::string printPerc = "", printPercTensorFlow = "";
    
    // Create a query & Aggregate
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        std::string& attName =  _td->getAttribute(var)->_name;

        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Query* query = varToQuery[var];
            const size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            const size_t& aggID = query->_aggregates[0]->_incoming[0].second;

            std::string viewStr = "V"+to_string(viewID);
            std::string typeStr = typeToStr(_td->getAttribute(var)->_type);
            
            percentileComp += offset(2)+"offset = 0; pIndex = 0;\n"+
                offset(2)+typeStr+" percentiles"+attName+"["+
                to_string(numberOfPercentiles-1)+"];\n"+
                offset(2)+"for ("+viewStr+"_tuple& tuple : "+viewStr+")\n"+
                offset(2)+"{\n"+
                offset(3)+"offset += tuple.aggregates["+to_string(aggID)+"];\n"+
                offset(3)+"while(offset >= percentileCounts[pIndex])\n"+offset(3)+"{\n"+
                offset(4)+"percentiles"+attName+"[pIndex] = tuple."+attName+";\n"+
                offset(4)+"++pIndex;\n"+offset(3)+"}\n"+
                offset(2)+"}\n\n";

            printPerc += offset(2)+"std::cout << \"{\"<<percentiles"+attName+"[0];\n"+
                offset(2)+"for (size_t p = 1; p < "+
                to_string(numberOfPercentiles-1)+"; ++p)\n"+
                offset(3)+"if (percentiles"+attName+"[p] != "+
                "percentiles"+attName+"[p-1])\n"+
                offset(4)+"std::cout << \",\" << percentiles"+attName+"[p];\n"+
                offset(2)+"std::cout << \"},// percentiles "+attName+"\"<< std::endl;\n";

            // 
            printPercTensorFlow += offset(2)+"std::cout << \"\'"+attName+"\': \" << \"[\"<<percentiles"+attName+"[0];\n"+
                offset(2)+"for (size_t p = 1; p < "+
                to_string(numberOfPercentiles-1)+"; ++p)\n"+
                offset(3)+"if (percentiles"+attName+"[p] != "+
                "percentiles"+attName+"[p-1])\n"+
                offset(4)+"std::cout << \",\" << percentiles"+attName+"[p];\n"+
                offset(2)+"std::cout << \"],  ## percentiles "+attName+"\"<< std::endl;\n";
        }
        else
        {
            printPerc += offset(2)+"std::cout << \"{},// percentiles "+attName+
                "\"<<std::endl;\n";
        }
    }
    // percentileComp += printPerc+offset(1)+"}\n\n";
    
    std::string runFunction = offset(1)+"void runApplication()\n"+offset(1)+"{\n"+
        offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n"+percentileComp+
        "\n"+offset(2)+"int64_t endProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Run Application: \"+"+
        "std::to_string(endProcess)+\"ms.\\n\";\n\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | " +
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << endProcess << std::endl;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+"std::cout << \"_thresholds = {\\n\";"+
        printPerc+
        // printPercTensorFlow+ // uncomment this for the percentiles used for tensorflow
        offset(2)+"std::cout << \"};\\n\";"+
        offset(1)+"}\n";
        
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n"<<
        "#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n"<<
        "#include \"DataHandler.h\"\n\n"<<
        "namespace lmfao\n{\n"<<
        offset(1)+"void runApplication();\n"<<
        "}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.cpp", std::ofstream::out);
    ofs << "#include \"ApplicationHandler.h\"\n"
        << "namespace lmfao\n{\n";
    ofs << runFunction << std::endl;
    ofs << "}\n";
    ofs.close();
    
}